

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O1

void __thiscall
LNodeF1Stmt::LNodeF1Stmt
          (LNodeF1Stmt *this,shared_ptr<LNode> *var,shared_ptr<LNode> *expr,shared_ptr<LNode> *stmts
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  peVar2 = (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

LNodeF1Stmt(std::shared_ptr<LNode> var, std::shared_ptr<LNode> expr, std::shared_ptr<LNode> stmts) {
        this->var = std::move(var);
        this->expr = std::move(expr);
        this->stmts = std::move(stmts);
    }